

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_36::WebSocketImpl::writeQueuedControlMessage(WebSocketImpl *this)

{
  Coroutine<void> *this_00;
  Mask *this_01;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_02;
  long *plVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  SourceLocation location;
  bool bVar6;
  coroutine_handle<void> handle;
  int iVar7;
  PromiseAwaiter<void> *__return_storage_ptr__;
  long in_RSI;
  Mask in_R9D;
  ArrayPtr<const_unsigned_char> AVar8;
  char *local_58;
  char *pcStack_50;
  undefined8 local_48;
  long local_40;
  Maybe<kj::EntropySource_&> local_38;
  
  handle._M_fr_ptr = operator_new(0x448);
  *(code **)handle._M_fr_ptr = writeQueuedControlMessage;
  *(code **)((long)handle._M_fr_ptr + 8) = writeQueuedControlMessage;
  this_00 = (Coroutine<void> *)((long)handle._M_fr_ptr + 0x10);
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_50 = "writeQueuedControlMessage";
  local_48 = 0x1500000e54;
  location.function = "writeQueuedControlMessage";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0xe54;
  location.columnNumber = 0x15;
  kj::_::Coroutine<void>::Coroutine(this_00,handle,location);
  kj::_::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  if (*(char *)(in_RSI + 0x310) == '\x01') {
    bVar6 = *(bool *)(in_RSI + 0x318);
    *(undefined8 *)((long)handle._M_fr_ptr + 0x410) = *(undefined8 *)(in_RSI + 800);
    *(undefined8 *)((long)handle._M_fr_ptr + 0x418) = *(undefined8 *)(in_RSI + 0x328);
    *(undefined8 *)(in_RSI + 800) = 0;
    *(undefined8 *)(in_RSI + 0x328) = 0;
    uVar3 = *(undefined4 *)(in_RSI + 0x334);
    uVar4 = *(undefined4 *)(in_RSI + 0x338);
    uVar5 = *(undefined4 *)(in_RSI + 0x33c);
    *(undefined4 *)((long)handle._M_fr_ptr + 0x420) = *(undefined4 *)(in_RSI + 0x330);
    *(undefined4 *)((long)handle._M_fr_ptr + 0x424) = uVar3;
    *(undefined4 *)((long)handle._M_fr_ptr + 0x428) = uVar4;
    *(undefined4 *)((long)handle._M_fr_ptr + 0x42c) = uVar5;
    *(undefined8 *)((long)handle._M_fr_ptr + 0x430) = *(undefined8 *)(in_RSI + 0x340);
    *(undefined8 *)(in_RSI + 0x340) = 0;
    Maybe<kj::(anonymous_namespace)::WebSocketImpl::ControlMessage>::operator=
              ((Maybe<kj::(anonymous_namespace)::WebSocketImpl::ControlMessage> *)(in_RSI + 0x310));
    if ((*(char *)(in_RSI + 0x160) == '\0') && (*(char *)(in_RSI + 0x161) != '\x01')) {
      this_01 = (Mask *)((long)handle._M_fr_ptr + 0x440);
      local_38.ptr = *(EntropySource **)(in_RSI + 0x20);
      Mask::Mask(this_01,&local_38);
      local_40 = (long)handle._M_fr_ptr + 0x3f0;
      this_02 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x438);
      if (*(int *)this_01->maskBytes != 0) {
        Mask::apply(this_01,*(ArrayPtr<unsigned_char> *)((long)handle._M_fr_ptr + 0x410));
      }
      uVar2 = *(undefined8 *)((long)handle._M_fr_ptr + 0x418);
      AVar8 = Header::compose((Header *)(in_RSI + 0x163),false,bVar6,(byte)uVar2,
                              (ulong)*(uint *)((long)handle._M_fr_ptr + 0x440),in_R9D);
      *(ArrayPtr<const_unsigned_char> *)((long)handle._M_fr_ptr + 0x3f0) = AVar8;
      *(undefined8 *)((long)handle._M_fr_ptr + 0x400) =
           *(undefined8 *)((long)handle._M_fr_ptr + 0x410);
      *(undefined8 *)((long)handle._M_fr_ptr + 0x408) = uVar2;
      (**(code **)(*(long *)(*(long *)(in_RSI + 0x18) + 8) + 8))
                (this_02,*(long *)(in_RSI + 0x18) + 8,local_40,2);
      __return_storage_ptr__ = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x238);
      co_await<void>(__return_storage_ptr__,(Promise<void> *)this_02);
      *(undefined1 *)((long)handle._M_fr_ptr + 0x444) = 0;
      bVar6 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
      if (bVar6) {
        return (PromiseBase)(PromiseBase)this;
      }
      kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
      kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr__);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(this_02);
      plVar1 = *(long **)((long)handle._M_fr_ptr + 0x430);
      iVar7 = 0;
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x10))(plVar1,&local_58);
      }
    }
    else {
      plVar1 = *(long **)((long)handle._M_fr_ptr + 0x430);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x10))(plVar1,&local_58);
      }
      kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
                ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_00);
      iVar7 = 3;
    }
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose
              ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0x428));
    Array<unsigned_char>::~Array((Array<unsigned_char> *)((long)handle._M_fr_ptr + 0x410));
    if (iVar7 != 0) {
      if (iVar7 != 3) {
        kj::_::Coroutine<void>::~Coroutine(this_00);
        operator_delete(handle._M_fr_ptr,0x448);
        return (PromiseBase)(PromiseBase)this;
      }
      goto LAB_00316892;
    }
  }
  kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
            ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_00);
LAB_00316892:
  *(undefined8 *)handle._M_fr_ptr = 0;
  *(undefined1 *)((long)handle._M_fr_ptr + 0x444) = 1;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> writeQueuedControlMessage() {
    KJ_IF_SOME(q, queuedControlMessage) {
      byte opcode = q.opcode;
      kj::Array<byte> payload = kj::mv(q.payload);
      auto maybeFulfiller = kj::mv(q.fulfiller);
      queuedControlMessage = kj::none;

      if (hasSentClose || disconnected) {
        KJ_IF_SOME(fulfiller, maybeFulfiller) {
          fulfiller->fulfill();
        }
        co_return;
      }

      Mask mask(maskKeyGenerator);
      if (!mask.isZero()) {
        mask.apply(payload);
      }

      kj::ArrayPtr<const byte> sendParts[2];
      sendParts[0] = sendHeader.compose(true, false, opcode, payload.size(), mask);
      sendParts[1] = payload;
      co_await stream->write(sendParts);
      KJ_IF_SOME(fulfiller, maybeFulfiller) {
        fulfiller->fulfill();
      }
    }
  }